

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O1

parse_status_t vfmatch(scanner_t *scanner,char *fmt,__va_list_tag *argp)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  undefined4 *puVar7;
  bool bVar8;
  uint uVar9;
  parse_status_t pVar10;
  parse_status_t pVar11;
  int iVar12;
  long *plVar13;
  int *piVar14;
  long lVar15;
  size_t sVar16;
  undefined8 *puVar17;
  __int32_t **pp_Var18;
  char *pcVar19;
  char cVar20;
  bool bVar21;
  token_type_t tok_type;
  token_type_t tok_type_2;
  memptr token_1;
  token_type_t tok_type_1;
  memptr token;
  memptr temp_str;
  token_type_t local_a4;
  undefined8 local_a0;
  int local_94;
  __va_list_tag *local_90;
  size_t local_88;
  long *local_80;
  memptr local_78;
  token_type_t local_64;
  size_t local_60;
  size_t local_58;
  memptr local_50;
  long local_40 [2];
  
  if (scanner == (scanner_t *)0x0) {
    __assert_fail("scanner != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3c0,
                  "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
  }
  if (fmt == (char *)0x0) {
    __assert_fail("fmt != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3c1,
                  "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
  }
  local_58 = scanner->cursor;
  cVar20 = *fmt;
  if (cVar20 == '\0') {
    bVar21 = true;
    pVar10 = PARSE_OK;
  }
  else {
    local_94 = 1;
    local_90 = argp;
    do {
      pcVar19 = fmt + 1;
      if (cVar20 == '\t') {
        pVar11 = scanner_get_token(scanner,&local_50,&local_a4);
        pVar10 = pVar11;
        if (local_a4 != TT_WHITESPACE) {
          pVar10 = PARSE_NO_MATCH;
        }
        if (pVar11 != PARSE_OK) {
          pVar10 = pVar11;
        }
        goto LAB_0010b46f;
      }
      if (cVar20 == ' ') {
        do {
          sVar4 = scanner->cursor;
          pVar10 = scanner_get_token(scanner,&local_78,(token_type_t *)&local_a0);
          bVar21 = true;
          if (pVar10 == PARSE_OK) {
            pVar10 = PARSE_OK;
            if ((token_type_t)local_a0 == TT_CRLF) {
              pVar10 = scanner_get_token(scanner,&local_78,(token_type_t *)&local_a0);
            }
            if ((pVar10 == PARSE_OK) && ((token_type_t)local_a0 == TT_WHITESPACE)) {
              bVar21 = false;
              pVar10 = PARSE_OK;
            }
            else {
              scanner->cursor = sVar4;
            }
          }
        } while (!bVar21);
        if (pVar10 == PARSE_INCOMPLETE) {
          pVar10 = (uint)(scanner->entire_msg_loaded != 0) * 3 + PARSE_INCOMPLETE;
        }
        goto LAB_0010b46f;
      }
      if (cVar20 != '%') {
        uVar5 = scanner->cursor;
        pVar10 = PARSE_INCOMPLETE;
        if (uVar5 < scanner->msg->length) {
          pcVar6 = scanner->msg->buf;
          scanner->cursor = uVar5 + 1;
          cVar2 = pcVar6[uVar5];
          if (local_94 == 0) {
            pp_Var18 = __ctype_tolower_loc();
            bVar21 = (*pp_Var18)[cVar20] == (*pp_Var18)[cVar2];
          }
          else {
            bVar21 = cVar2 == cVar20;
          }
          pVar10 = bVar21 ^ PARSE_NO_MATCH;
        }
        goto LAB_0010b46f;
      }
      bVar1 = fmt[1];
      pcVar19 = fmt + 2;
      pVar11 = PARSE_OK;
      uVar9 = (uint)bVar1;
      pVar10 = pVar11;
      if (bVar1 < 99) {
        if (bVar1 < 0x4c) {
          if ((uVar9 != 0x20) && (uVar9 != 0x25)) {
            if (uVar9 != 0x30) goto switchD_0010b2b9_caseD_4d;
            if ((scanner->cursor != scanner->msg->length) ||
               (scanner->msg->buf[scanner->cursor] != '\0')) {
              pVar10 = PARSE_NO_MATCH;
            }
            goto LAB_0010b46f;
          }
          uVar5 = scanner->cursor;
          pVar10 = PARSE_INCOMPLETE;
          if (scanner->msg->length <= uVar5) goto LAB_0010b46f;
          pcVar6 = scanner->msg->buf;
          scanner->cursor = uVar5 + 1;
          bVar3 = pcVar6[uVar5];
          if (local_94 == 0) {
            pp_Var18 = __ctype_tolower_loc();
            bVar21 = (*pp_Var18)[(char)bVar1] == (*pp_Var18)[(char)bVar3];
          }
          else {
            bVar21 = bVar3 == bVar1;
          }
          goto LAB_0010b9ee;
        }
        if (9 < uVar9 - 0x4c) {
switchD_0010b2b9_caseD_4d:
          __assert_fail("0",".upnp/src/genlib/net/http/httpparser.c",0x43a,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        plVar13 = local_40;
        switch(uVar9) {
        case 0x4c:
          uVar9 = local_90->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            plVar13 = (long *)((ulong)uVar9 + (long)local_90->reg_save_area);
            local_90->gp_offset = uVar9 + 8;
          }
          else {
            plVar13 = (long *)local_90->overflow_arg_area;
            local_90->overflow_arg_area = plVar13 + 1;
          }
          plVar13 = (long *)*plVar13;
          if (plVar13 == (long *)0x0) {
            __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x403,
                          "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)"
                         );
          }
          sVar4 = scanner->cursor;
          *plVar13 = (long)(scanner->msg->buf + sVar4);
          do {
            pVar10 = scanner_get_token(scanner,&local_78,(token_type_t *)&local_a0);
            if (pVar10 != PARSE_OK) break;
          } while ((token_type_t)local_a0 != TT_CRLF);
          if (pVar10 == PARSE_OK) {
            sVar16 = scanner->cursor - local_78.length;
            scanner->cursor = sVar16;
            plVar13[1] = sVar16 - sVar4;
          }
          break;
        default:
          goto switchD_0010b2b9_caseD_4d;
        case 0x50:
          uVar9 = local_90->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar9 + (long)local_90->reg_save_area);
            local_90->gp_offset = uVar9 + 8;
          }
          else {
            puVar17 = (undefined8 *)local_90->overflow_arg_area;
            local_90->overflow_arg_area = puVar17 + 1;
          }
          if ((undefined4 *)*puVar17 == (undefined4 *)0x0) {
            __assert_fail("int_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x429,
                          "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)"
                         );
          }
          *(undefined4 *)*puVar17 = (int)scanner->cursor;
          break;
        case 0x52:
          uVar9 = local_90->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            plVar13 = (long *)((ulong)uVar9 + (long)local_90->reg_save_area);
            local_90->gp_offset = uVar9 + 8;
          }
          else {
            plVar13 = (long *)local_90->overflow_arg_area;
            local_90->overflow_arg_area = plVar13 + 1;
          }
          plVar13 = (long *)*plVar13;
          if (plVar13 == (long *)0x0) {
            __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3cd,
                          "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)"
                         );
          }
          local_88 = scanner->cursor;
          *plVar13 = (long)(scanner->msg->buf + local_88);
          plVar13[1] = 0;
          bVar8 = false;
          local_60 = 0;
          bVar21 = false;
          local_80 = plVar13;
          do {
            pVar10 = scanner_get_token(scanner,&local_78,(token_type_t *)&local_a0);
            if (pVar10 == PARSE_OK) {
              if (bVar21) {
                if ((token_type_t)local_a0 != TT_WHITESPACE) {
                  scanner->cursor = local_60;
                  bVar21 = true;
                  goto LAB_0010b763;
                }
                local_80[1] = local_80[1] + local_78.length;
                bVar21 = false;
              }
              else {
                bVar21 = (token_type_t)local_a0 == TT_CRLF;
                if (bVar21) {
                  local_60 = scanner->cursor - local_78.length;
                }
                local_80[1] = local_80[1] + local_78.length;
              }
            }
            else {
              scanner->cursor = local_88;
LAB_0010b763:
              bVar8 = true;
            }
          } while (!bVar8);
          if ((pVar10 == PARSE_OK) && (lVar15 = local_80[1], lVar15 != 0)) {
            do {
              lVar15 = lVar15 + -1;
              if ((0x20 < (ulong)*(byte *)(*local_80 + lVar15)) ||
                 ((0x100002600U >> ((ulong)*(byte *)(*local_80 + lVar15) & 0x3f) & 1) == 0)) break;
              local_80[1] = lVar15;
            } while (lVar15 != 0);
          }
          break;
        case 0x53:
          uVar9 = local_90->gp_offset;
          if ((ulong)uVar9 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar9 + (long)local_90->reg_save_area);
            local_90->gp_offset = uVar9 + 8;
          }
          else {
            puVar17 = (undefined8 *)local_90->overflow_arg_area;
            local_90->overflow_arg_area = puVar17 + 1;
          }
          plVar13 = (long *)*puVar17;
        case 0x55:
          local_88 = CONCAT71(local_88._1_7_,bVar1);
          if (plVar13 == (long *)0x0) {
            __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3f3,
                          "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)"
                         );
          }
          local_80 = (long *)scanner->cursor;
          plVar13[1] = 0;
          *plVar13 = (long)(scanner->msg->buf + (long)local_80);
          bVar21 = false;
          do {
            pVar10 = scanner_get_token(scanner,&local_78,(token_type_t *)&local_a0);
            bVar8 = true;
            if ((pVar10 == PARSE_OK) && ((token_type_t)local_a0 - TT_CTRL < 0xfffffffe)) {
              plVar13[1] = plVar13[1] + local_78.length;
              bVar8 = bVar21;
            }
            bVar21 = bVar8;
          } while (!bVar8);
          if (pVar10 == PARSE_INCOMPLETE) {
            if (scanner->entire_msg_loaded == 0) goto LAB_0010b974;
LAB_0010b963:
            pVar10 = (plVar13[1] == 0) + PARSE_OK;
          }
          else {
            if (pVar10 == PARSE_OK) {
              scanner->cursor = scanner->cursor - local_78.length;
              goto LAB_0010b963;
            }
LAB_0010b974:
            scanner->cursor = (size_t)local_80;
          }
          if (((char)local_88 == 'U') && (pVar10 == PARSE_OK)) {
            uVar9 = local_90->gp_offset;
            if ((ulong)uVar9 < 0x29) {
              puVar17 = (undefined8 *)((ulong)uVar9 + (long)local_90->reg_save_area);
              local_90->gp_offset = uVar9 + 8;
            }
            else {
              puVar17 = (undefined8 *)local_90->overflow_arg_area;
              local_90->overflow_arg_area = puVar17 + 1;
            }
            if ((uri_type *)*puVar17 == (uri_type *)0x0) {
              __assert_fail("uri_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3f8,
                            "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)"
                           );
            }
            iVar12 = parse_uri((char *)*plVar13,plVar13[1],(uri_type *)*puVar17);
            bVar21 = iVar12 == 1;
LAB_0010b9ee:
            pVar10 = bVar21 ^ PARSE_NO_MATCH;
          }
        }
        goto LAB_0010b46f;
      }
      if (bVar1 < 0x6e) {
        if (bVar1 == 99) {
          pVar11 = scanner_get_token(scanner,&local_50,&local_a4);
          bVar21 = local_a4 == TT_CRLF;
          goto LAB_0010b812;
        }
        if (bVar1 == 100) goto switchD_0010b3e9_caseD_78;
        if (bVar1 != 0x69) goto switchD_0010b2b9_caseD_4d;
        local_94 = 0;
        goto LAB_0010b46f;
      }
      switch(uVar9) {
      case 0x6e:
        local_94 = 1;
        break;
      default:
        goto switchD_0010b2b9_caseD_4d;
      case 0x71:
        uVar9 = local_90->gp_offset;
        if ((ulong)uVar9 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar9 + (long)local_90->reg_save_area);
          local_90->gp_offset = uVar9 + 8;
        }
        else {
          puVar17 = (undefined8 *)local_90->overflow_arg_area;
          local_90->overflow_arg_area = puVar17 + 1;
        }
        pVar11 = scanner_get_token(scanner,(memptr *)*puVar17,&local_a4);
        bVar21 = local_a4 == TT_QUOTEDSTRING;
        goto LAB_0010b812;
      case 0x73:
        uVar9 = local_90->gp_offset;
        if ((ulong)uVar9 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar9 + (long)local_90->reg_save_area);
          local_90->gp_offset = uVar9 + 8;
        }
        else {
          puVar17 = (undefined8 *)local_90->overflow_arg_area;
          local_90->overflow_arg_area = puVar17 + 1;
        }
        if ((memptr *)*puVar17 == (memptr *)0x0) {
          __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3d2,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        pVar11 = scanner_get_token(scanner,(memptr *)*puVar17,&local_a4);
        bVar21 = local_a4 == TT_IDENTIFIER;
LAB_0010b812:
        pVar10 = pVar11;
        if (!bVar21) {
          pVar10 = PARSE_NO_MATCH;
        }
        if (pVar11 != PARSE_OK) {
          pVar10 = pVar11;
        }
        break;
      case 0x77:
        pVar10 = scanner_get_token(scanner,&local_50,&local_a4);
        if ((pVar10 == PARSE_OK) && (local_a4 != TT_WHITESPACE)) {
          scanner->cursor = scanner->cursor - local_50.length;
          pVar10 = pVar11;
        }
        break;
      case 0x78:
switchD_0010b3e9_caseD_78:
        uVar9 = local_90->gp_offset;
        if ((ulong)uVar9 < 0x29) {
          plVar13 = (long *)((ulong)uVar9 + (long)local_90->reg_save_area);
          local_90->gp_offset = uVar9 + 8;
        }
        else {
          plVar13 = (long *)local_90->overflow_arg_area;
          local_90->overflow_arg_area = plVar13 + 1;
        }
        puVar7 = (undefined4 *)*plVar13;
        if (puVar7 == (undefined4 *)0x0) {
          __assert_fail("int_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",1000,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        iVar12 = 0x10;
        if (bVar1 == 100) {
          iVar12 = 10;
        }
        local_88 = scanner->cursor;
        pVar10 = scanner_get_token(scanner,&local_78,&local_64);
        if ((pVar10 == PARSE_OK) && (pVar10 = PARSE_NO_MATCH, local_64 == TT_IDENTIFIER)) {
          piVar14 = __errno_location();
          *piVar14 = 0;
          lVar15 = strtol(local_78.buf,(char **)&local_a0,iVar12);
          if (((lVar15 < 0) ||
              ((char *)CONCAT44(local_a0._4_4_,(token_type_t)local_a0) !=
               local_78.buf + local_78.length)) ||
             ((pVar10 = PARSE_OK, lVar15 == 0x7fffffffffffffff && (*piVar14 == 0x22)))) {
            pVar10 = PARSE_NO_MATCH;
          }
          *puVar7 = (int)lVar15;
        }
        if (pVar10 != PARSE_OK) {
          scanner->cursor = local_88;
        }
      }
LAB_0010b46f:
      cVar20 = *pcVar19;
      bVar21 = pVar10 == PARSE_OK;
    } while ((cVar20 != '\0') && (fmt = pcVar19, pVar10 == PARSE_OK));
  }
  if (!bVar21) {
    scanner->cursor = local_58;
  }
  return pVar10;
}

Assistant:

static parse_status_t vfmatch(scanner_t *scanner, const char *fmt, va_list argp)
{
	char c;
	const char *fmt_ptr = fmt;
	parse_status_t status;
	memptr *str_ptr;
	memptr temp_str;
	int *int_ptr;
	uri_type *uri_ptr;
	size_t save_pos;
	int stat;
	int case_sensitive = 1;
	memptr token;
	token_type_t tok_type;
	int base;

	assert(scanner != NULL);
	assert(fmt != NULL);

	/* save scanner pos; to aid error recovery */
	save_pos = scanner->cursor;

	status = PARSE_OK;
	while ((c = *fmt_ptr++) && (status == (parse_status_t)PARSE_OK)) {
		if (c == '%') {
			c = *fmt_ptr++;
			switch (c) {
			case 'R': /* raw value */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = match_raw_value(scanner, str_ptr);
				break;
			case 's': /* simple identifier */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = scanner_get_token(
					scanner, str_ptr, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_IDENTIFIER) {
					/* not an identifier */
					status = PARSE_NO_MATCH;
				}
				break;
			case 'c': /* crlf */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type != (token_type_t)TT_CRLF) {
					/* not CRLF token */
					status = PARSE_NO_MATCH;
				}
				break;
			case 'd': /* integer */
			case 'x': /* hex number */
				int_ptr = va_arg(argp, int *);
				assert(int_ptr != NULL);
				base = c == 'd' ? 10 : 16;
				status = match_int(scanner, base, int_ptr);
				break;
			case 'S': /* non-whitespace string */
			case 'U': /* uri */
				if (c == 'S') {
					str_ptr = va_arg(argp, memptr *);
				} else {
					str_ptr = &temp_str;
				}
				assert(str_ptr != NULL);
				status = match_non_ws_string(scanner, str_ptr);
				if (c == 'U' &&
					status == (parse_status_t)PARSE_OK) {
					uri_ptr = va_arg(argp, uri_type *);
					assert(uri_ptr != NULL);
					stat = parse_uri(str_ptr->buf,
						str_ptr->length,
						uri_ptr);
					if (stat != HTTP_SUCCESS) {
						status = PARSE_NO_MATCH;
					}
				}
				break;
			case 'L': /* string till eol */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = read_until_crlf(scanner, str_ptr);
				break;
			case ' ': /* match space */
			case '%': /* match percentage symbol */
				status = match_char(scanner, c, case_sensitive);
				break;
			case 'n': /* case-sensitive match */
				case_sensitive = 1;
				break;
			case 'i': /* ignore case */
				case_sensitive = 0;
				break;
			case 'q': /* quoted string */
				str_ptr = (memptr *)va_arg(argp, memptr *);
				status = scanner_get_token(
					scanner, str_ptr, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_QUOTEDSTRING) {
					status = PARSE_NO_MATCH; /* not a quoted
								    string */
				}
				break;
			case 'w':
				/* optional whitespace */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_WHITESPACE) {
					/* restore non-whitespace token */
					scanner->cursor -= token.length;
				}
				break;
			case 'P':
				/* current pos of scanner */
				int_ptr = va_arg(argp, int *);
				assert(int_ptr != NULL);
				*int_ptr = (int)scanner->cursor;
				break;
				/* valid only in matchstr() */
			case '0':
				/* end of msg? */
				/* check that we are 1 beyond last char */
				if (scanner->cursor == scanner->msg->length &&
					scanner->msg->buf[scanner->cursor] ==
						'\0') {
					status = PARSE_OK;
				} else {
					status = PARSE_NO_MATCH;
				}
				break;
			default:
				/* unknown option */
				assert(0);
			}
		} else {
			switch (c) {
			case ' ': /* LWS* */
				status = skip_lws(scanner);
				break;
			case '\t': /* Whitespace */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_WHITESPACE) {
					/* not whitespace token */
					status = PARSE_NO_MATCH;
				}
				break;
			default: /* match characters */
			{
				status = match_char(scanner, c, case_sensitive);
			}
			}
		}
	}
	if (status != (parse_status_t)PARSE_OK) {
		/* on error, restore original scanner pos */
		scanner->cursor = save_pos;
	}

	return status;
}